

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [24];
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint uVar8;
  void *pvVar9;
  parasail_matrix_t *ppVar10;
  void *pvVar11;
  void *pvVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  undefined1 auVar15 [32];
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int64_t *ptr_06;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  longlong lVar26;
  int iVar27;
  int iVar28;
  longlong lVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  undefined4 in_register_00000014;
  ulong uVar33;
  long lVar34;
  longlong lVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  undefined8 uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  int iVar47;
  __m256i *palVar48;
  ulong uVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar75 [32];
  undefined1 auVar72 [16];
  undefined1 auVar76 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [16];
  undefined1 auVar87 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  __m256i_64_t h;
  undefined1 in_stack_fffffffffffffb60 [16];
  int local_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_380 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  longlong local_80 [10];
  
  auVar66 = local_3c0;
  local_3c0._4_4_ = in_register_00000014;
  local_3c0._0_4_ = s2Len;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar9 = (profile->profile64).score;
    if (pvVar9 == (void *)0x0) {
      parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar10 = profile->matrix;
      if (ppVar10 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar8 = profile->s1Len;
        if ((int)uVar8 < 1) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_1();
        }
        else {
          local_3c0._8_24_ = auVar66._8_24_;
          iVar16 = uVar8 - 1;
          uVar46 = (ulong)uVar8 + 3;
          uVar51 = uVar46 >> 2;
          uVar50 = (uint)uVar51;
          iVar36 = iVar16 / (int)uVar50;
          uVar30 = iVar16 % (int)uVar50;
          local_2c0._0_4_ = uVar30;
          uVar38 = CONCAT44(0,open);
          iVar27 = -open;
          iVar20 = ppVar10->min;
          local_380._0_4_ = iVar27;
          pvVar11 = (profile->profile64).matches;
          pvVar12 = (profile->profile64).similar;
          uVar40 = 0x8000000000000000 - (long)iVar20;
          if (iVar20 != iVar27 && SBORROW4(iVar20,iVar27) == iVar20 + open < 0) {
            uVar40 = uVar38 | 0x8000000000000000;
          }
          iVar20 = ppVar10->max;
          ppVar21 = parasail_result_new_stats();
          if (ppVar21 != (parasail_result_t *)0x0) {
            ppVar21->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar21->flag | 0x4810402;
            b = parasail_memalign___m256i(0x20,uVar51);
            b_00 = parasail_memalign___m256i(0x20,uVar51);
            b_01 = parasail_memalign___m256i(0x20,uVar51);
            b_02 = parasail_memalign___m256i(0x20,uVar51);
            ptr = parasail_memalign___m256i(0x20,uVar51);
            b_03 = parasail_memalign___m256i(0x20,uVar51);
            b_04 = parasail_memalign___m256i(0x20,uVar51);
            b_05 = parasail_memalign___m256i(0x20,uVar51);
            ptr_00 = parasail_memalign___m256i(0x20,uVar51);
            ptr_01 = parasail_memalign___m256i(0x20,uVar51);
            ptr_02 = parasail_memalign___m256i(0x20,uVar51);
            ptr_03 = parasail_memalign___m256i(0x20,uVar51);
            ptr_04 = parasail_memalign___m256i(0x20,uVar51);
            ptr_05 = parasail_memalign___m256i(0x20,uVar51);
            ptr_06 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_06 != (int64_t *)0x0 &&
                (ptr_05 != (__m256i *)0x0 && (ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0))
                ) && ((ptr_02 != (__m256i *)0x0 &&
                      (ptr_01 != (__m256i *)0x0 &&
                      (ptr_00 != (__m256i *)0x0 && b_05 != (__m256i *)0x0))) &&
                     ((b_04 != (__m256i *)0x0 && (b_03 != (__m256i *)0x0 && ptr != (__m256i *)0x0))
                     && ((b_02 != (__m256i *)0x0 && b_01 != (__m256i *)0x0) &&
                        (b_00 != (__m256i *)0x0 && b != (__m256i *)0x0))))) {
              iVar17 = s2Len + -1;
              iVar18 = 3 - iVar36;
              uVar33 = CONCAT44(0,gap);
              auVar65._8_4_ = gap;
              auVar65._0_8_ = uVar33;
              auVar65._12_4_ = 0;
              auVar65._16_4_ = gap;
              auVar65._20_4_ = 0;
              auVar65._24_4_ = gap;
              auVar65._28_4_ = 0;
              uVar40 = uVar40 + 1;
              lVar34 = 0x7ffffffffffffffe - (long)iVar20;
              auVar66._8_8_ = uVar46;
              auVar66._0_8_ = uVar46;
              auVar66._16_8_ = uVar46;
              auVar66._24_8_ = uVar46;
              auVar66 = vpsrlq_avx2(auVar66,2);
              auVar14 = vpblendd_avx2(auVar66,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar85 = ZEXT832(uVar40);
              lVar22 = (long)(int)-(uVar50 * gap);
              auVar67._8_8_ = lVar22;
              auVar67._0_8_ = lVar22;
              auVar67._16_8_ = lVar22;
              auVar67._24_8_ = lVar22;
              auVar66 = vpblendd_avx2(auVar67,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar66 = vpaddq_avx2(ZEXT832(uVar40),auVar66);
              alVar2[2] = (longlong)b_05;
              alVar2[0] = in_stack_fffffffffffffb60._0_8_;
              alVar2[1] = in_stack_fffffffffffffb60._8_8_;
              alVar2[3] = (longlong)b_04;
              parasail_memset___m256i(b_03,alVar2,uVar51);
              alVar3[2] = (longlong)b_05;
              alVar3[0] = in_stack_fffffffffffffb60._0_8_;
              alVar3[1] = in_stack_fffffffffffffb60._8_8_;
              alVar3[3] = (longlong)b_04;
              parasail_memset___m256i(b_04,alVar3,uVar51);
              alVar4[2] = (longlong)b_05;
              alVar4[0] = in_stack_fffffffffffffb60._0_8_;
              alVar4[1] = in_stack_fffffffffffffb60._8_8_;
              alVar4[3] = (longlong)b_04;
              parasail_memset___m256i(b_05,alVar4,uVar51);
              alVar5[2] = (longlong)b_05;
              alVar5[0] = in_stack_fffffffffffffb60._0_8_;
              alVar5[1] = in_stack_fffffffffffffb60._8_8_;
              alVar5[3] = (longlong)b_04;
              parasail_memset___m256i(b,alVar5,uVar51);
              c[2] = (longlong)b_05;
              c[0] = in_stack_fffffffffffffb60._0_8_;
              c[1] = in_stack_fffffffffffffb60._8_8_;
              c[3] = (longlong)b_04;
              parasail_memset___m256i(b_00,c,uVar51);
              c_00[2] = (longlong)b_05;
              c_00[0] = in_stack_fffffffffffffb60._0_8_;
              c_00[1] = in_stack_fffffffffffffb60._8_8_;
              c_00[3] = (longlong)b_04;
              parasail_memset___m256i(b_01,c_00,uVar51);
              c_01[2] = (longlong)b_05;
              c_01[0] = in_stack_fffffffffffffb60._0_8_;
              c_01[1] = in_stack_fffffffffffffb60._8_8_;
              c_01[3] = (longlong)b_04;
              parasail_memset___m256i(b_02,c_01,uVar51);
              auVar77._8_4_ = open;
              auVar77._0_8_ = uVar38;
              auVar77._12_4_ = 0;
              auVar77._16_4_ = open;
              auVar77._20_4_ = 0;
              auVar77._24_4_ = open;
              auVar77._28_4_ = 0;
              auVar67 = vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar77);
              uVar19 = uVar50 - 1;
              lVar22 = (ulong)uVar19 << 5;
              auVar75._8_8_ = 1;
              auVar75._0_8_ = 1;
              auVar75._16_8_ = 1;
              auVar75._24_8_ = 1;
              auVar77 = vpcmpeqd_avx2(auVar85,auVar85);
              uVar41 = uVar51;
              do {
                *(undefined1 (*) [32])((long)*ptr_04 + lVar22) = auVar67;
                *(undefined1 (*) [32])((long)*ptr_05 + lVar22) = auVar75;
                auVar67 = vpsubq_avx2(auVar67,auVar65);
                auVar75 = vpsubq_avx2(auVar75,auVar77);
                lVar22 = lVar22 + -0x20;
                iVar20 = (int)uVar41;
                uVar31 = iVar20 - 1;
                uVar41 = (ulong)uVar31;
              } while (uVar31 != 0 && 0 < iVar20);
              lVar22 = (long)iVar27;
              uVar41 = 0;
              do {
                lVar44 = 0;
                lVar43 = lVar22;
                do {
                  lVar26 = lVar43;
                  if (s1_beg != 0) {
                    lVar26 = 0;
                  }
                  local_80[lVar44] = lVar26;
                  lVar44 = lVar44 + 1;
                  lVar43 = lVar43 - uVar51 * uVar33;
                } while (lVar44 != 4);
                palVar48 = ptr + uVar41;
                (*palVar48)[0] = local_80[0];
                (*palVar48)[1] = local_80[1];
                (*palVar48)[2] = local_80[2];
                (*palVar48)[3] = local_80[3];
                uVar41 = uVar41 + 1;
                lVar22 = lVar22 - uVar33;
              } while (uVar41 != uVar51);
              *ptr_06 = 0;
              uVar41 = 1;
              do {
                iVar20 = 0;
                if (s2_beg == 0) {
                  iVar20 = iVar27;
                }
                ptr_06[uVar41] = (long)iVar20;
                uVar41 = uVar41 + 1;
                iVar27 = iVar27 - gap;
              } while (s2Len + 1 != uVar41);
              palVar48 = ptr + uVar30;
              uVar41 = 1;
              if (1 < s2Len) {
                uVar41 = (ulong)(uint)s2Len;
              }
              lVar22 = (ulong)(uVar50 + (uVar50 == 0)) << 5;
              auVar85._8_8_ = uVar40;
              auVar85._0_8_ = uVar40;
              auVar85._16_8_ = uVar40;
              auVar85._24_8_ = uVar40;
              auVar78 = ZEXT3264(auVar85);
              auVar97 = ZEXT3264(auVar85);
              auVar104 = ZEXT3264(auVar85);
              auVar87 = ZEXT3264(auVar85);
              auVar115 = ZEXT3264(auVar85);
              auVar121 = ZEXT3264(CONCAT824(lVar34,CONCAT816(lVar34,CONCAT88(lVar34,lVar34))));
              uVar33 = 0;
              iVar20 = iVar17;
              do {
                alVar2 = ptr[uVar19];
                alVar3 = b_03[uVar19];
                alVar4 = b_04[uVar19];
                alVar5 = b_05[uVar19];
                auVar56 = alVar2._0_16_;
                auVar100._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar56;
                auVar100._16_16_ = ZEXT116(0) * alVar2._16_16_ + ZEXT116(1) * auVar56;
                auVar77 = vpalignr_avx2((undefined1  [32])alVar2,auVar100,8);
                auVar67 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                auVar67 = vpalignr_avx2((undefined1  [32])alVar3,auVar67,8);
                auVar75 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                auVar75 = vpalignr_avx2((undefined1  [32])alVar4,auVar75,8);
                auVar85 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                auVar85 = vpalignr_avx2((undefined1  [32])alVar5,auVar85,8);
                auVar100 = vpblendd_avx2(auVar77,ZEXT832((ulong)ptr_06[uVar33]),3);
                lVar43 = uVar51 * (long)ppVar10->mapper[(byte)s2[uVar33]] * 0x20;
                auVar116._8_8_ = uVar40;
                auVar116._0_8_ = uVar40;
                auVar116._16_8_ = uVar40;
                auVar116._24_8_ = uVar40;
                auVar77 = vpsubq_avx2(auVar116,(undefined1  [32])*ptr_04);
                local_2a0 = ZEXT1632(ZEXT816(0));
                lVar44 = 0;
                auVar126 = ZEXT864(0) << 0x40;
                auVar127 = ZEXT864(0) << 0x40;
                do {
                  auVar6 = *(undefined1 (*) [32])((long)*ptr + lVar44);
                  auVar69 = *(undefined1 (*) [32])((long)*b_03 + lVar44);
                  auVar101 = *(undefined1 (*) [32])((long)*b_04 + lVar44);
                  auVar7._8_4_ = open;
                  auVar7._0_8_ = uVar38;
                  auVar7._12_4_ = 0;
                  auVar7._16_4_ = open;
                  auVar7._20_4_ = 0;
                  auVar7._24_4_ = open;
                  auVar7._28_4_ = 0;
                  auVar119 = vpsubq_avx2(auVar6,auVar7);
                  auVar102 = vpsubq_avx2(*(undefined1 (*) [32])((long)*b + lVar44),auVar65);
                  auVar124 = vpcmpgtq_avx2(auVar119,auVar102);
                  auVar68 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_00 + lVar44),auVar69,
                                          auVar124);
                  auVar108 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_01 + lVar44),auVar101,
                                           auVar124);
                  auVar7 = *(undefined1 (*) [32])((long)*b_05 + lVar44);
                  auVar124 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_02 + lVar44),auVar7,
                                           auVar124);
                  uVar25 = auVar102._0_8_;
                  if ((long)auVar102._0_8_ < (long)auVar119._0_8_) {
                    uVar25 = auVar119._0_8_;
                  }
                  uVar23 = vpextrq_avx(auVar119._0_16_,1);
                  uVar42 = vpextrq_avx(auVar102._0_16_,1);
                  if ((long)uVar42 < (long)uVar23) {
                    uVar42 = uVar23;
                  }
                  uVar24 = vpextrq_avx(auVar119._16_16_,1);
                  uVar49 = vpextrq_avx(auVar102._16_16_,1);
                  uVar23 = auVar102._16_8_;
                  if ((long)auVar102._16_8_ < (long)auVar119._16_8_) {
                    uVar23 = auVar119._16_8_;
                  }
                  if ((long)uVar49 < (long)uVar24) {
                    uVar49 = uVar24;
                  }
                  auVar77 = vpaddq_avx2(auVar77,*(undefined1 (*) [32])((long)*ptr_04 + lVar44));
                  uVar24 = auVar77._0_8_;
                  if ((long)auVar77._0_8_ < (long)auVar116._0_8_) {
                    uVar24 = auVar116._0_8_;
                  }
                  uVar54 = vpextrq_avx(auVar116._0_16_,1);
                  auVar56._8_8_ = 0;
                  auVar56._0_8_ = uVar49;
                  auVar109._8_8_ = 0;
                  auVar109._0_8_ = uVar23;
                  auVar56 = vpunpcklqdq_avx(auVar109,auVar56);
                  uVar45 = vpextrq_avx(auVar77._0_16_,1);
                  if ((long)uVar45 < (long)uVar54) {
                    uVar45 = uVar54;
                  }
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ = uVar42;
                  auVar118._8_8_ = 0;
                  auVar118._0_8_ = uVar25;
                  auVar109 = vpunpcklqdq_avx(auVar118,auVar110);
                  uVar52 = vpextrq_avx(auVar116._16_16_,1);
                  uVar55 = vpextrq_avx(auVar77._16_16_,1);
                  uVar54 = auVar77._16_8_;
                  if ((long)auVar77._16_8_ < (long)auVar116._16_8_) {
                    uVar54 = auVar116._16_8_;
                  }
                  auVar119._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar109;
                  auVar119._16_16_ = ZEXT116(1) * auVar56;
                  if ((long)uVar55 < (long)uVar52) {
                    uVar55 = uVar52;
                  }
                  auVar116 = vpcmpgtq_avx2(auVar77,auVar116);
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ = uVar55;
                  auVar89._8_8_ = 0;
                  auVar89._0_8_ = uVar54;
                  auVar56 = vpunpcklqdq_avx(auVar89,auVar88);
                  auVar102 = vblendvpd_avx(auVar127._0_32_,local_2c0,auVar116);
                  auVar127 = ZEXT3264(auVar102);
                  auVar86 = vblendvpd_avx(auVar126._0_32_,local_3c0,auVar116);
                  auVar126 = ZEXT3264(auVar86);
                  auVar77 = vpaddq_avx2(auVar100,*(undefined1 (*) [32])
                                                  ((long)pvVar9 + lVar44 + lVar43));
                  auVar67 = vpaddq_avx2(auVar67,*(undefined1 (*) [32])
                                                 ((long)pvVar11 + lVar44 + lVar43));
                  auVar75 = vpaddq_avx2(auVar75,*(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar44 + lVar43));
                  auVar100 = vpaddq_avx2(local_380,*(undefined1 (*) [32])((long)*ptr_05 + lVar44));
                  local_2a0 = vblendvpd_avx(local_2a0,auVar100,auVar116);
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = uVar45;
                  auVar111._8_8_ = 0;
                  auVar111._0_8_ = uVar24;
                  auVar109 = vpunpcklqdq_avx(auVar111,auVar79);
                  auVar100 = vpcmpeqd_avx2(ZEXT832(uVar24),ZEXT832(uVar24));
                  auVar103 = vpsubq_avx2(auVar85,auVar100);
                  *(undefined1 (*) [32])((long)*b + lVar44) = auVar119;
                  auVar100 = vpsubq_avx2(auVar124,auVar100);
                  auVar85 = vpcmpgtq_avx2(auVar119,auVar77);
                  *(undefined1 (*) [32])((long)*b_00 + lVar44) = auVar68;
                  local_2c0 = vblendvpd_avx(auVar67,auVar68,auVar85);
                  *(undefined1 (*) [32])((long)*b_01 + lVar44) = auVar108;
                  local_3c0 = vblendvpd_avx(auVar75,auVar108,auVar85);
                  local_380 = vblendvpd_avx(auVar103,auVar100,auVar85);
                  *(undefined1 (*) [32])((long)*b_02 + lVar44) = auVar100;
                  if ((long)uVar25 <= (long)auVar77._0_8_) {
                    uVar25 = auVar77._0_8_;
                  }
                  uVar52 = vpextrq_avx(auVar77._0_16_,1);
                  auVar116._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar109;
                  auVar116._16_16_ = ZEXT116(1) * auVar56;
                  uVar53 = vpextrq_avx(auVar77._16_16_,1);
                  if ((long)uVar42 <= (long)uVar52) {
                    uVar42 = uVar52;
                  }
                  if ((long)uVar23 <= (long)auVar77._16_8_) {
                    uVar23 = auVar77._16_8_;
                  }
                  if ((long)uVar49 <= (long)uVar53) {
                    uVar49 = uVar53;
                  }
                  *(undefined1 (*) [32])((long)*ptr + lVar44) = auVar77;
                  *(undefined1 (*) [32])((long)*b_03 + lVar44) = auVar67;
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = uVar25;
                  auVar90._8_8_ = 0;
                  auVar90._0_8_ = uVar42;
                  auVar56 = vpunpcklqdq_avx(auVar71,auVar90);
                  *(undefined1 (*) [32])((long)*b_04 + lVar44) = auVar75;
                  auVar57._8_8_ = 0;
                  auVar57._0_8_ = uVar23;
                  auVar108._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar56;
                  auVar108._16_16_ = ZEXT116(1) * auVar57;
                  *(undefined1 (*) [32])((long)*b_05 + lVar44) = auVar103;
                  auVar68._8_8_ = uVar49;
                  auVar68._0_8_ = uVar49;
                  auVar68._16_8_ = uVar49;
                  auVar68._24_8_ = uVar49;
                  auVar77 = vpblendd_avx2(auVar108,auVar68,0xc0);
                  lVar44 = lVar44 + 0x20;
                  auVar75 = auVar101;
                  auVar85 = auVar7;
                  auVar100 = auVar6;
                  auVar67 = auVar69;
                } while (lVar22 != lVar44);
                auVar6._8_4_ = open;
                auVar6._0_8_ = uVar38;
                auVar6._12_4_ = 0;
                auVar6._16_4_ = open;
                auVar6._20_4_ = 0;
                auVar6._24_4_ = open;
                auVar6._28_4_ = 0;
                auVar69._8_8_ = uVar42;
                auVar69._0_8_ = uVar42;
                auVar69._16_8_ = uVar42;
                auVar69._24_8_ = uVar42;
                auVar67 = vpunpcklqdq_avx2(auVar69,auVar108);
                auVar77 = vperm2f128_avx(local_2c0,local_2c0,8);
                local_2c0 = vpalignr_avx2(local_2c0,auVar77,8);
                auVar77 = vperm2f128_avx(local_3c0,local_3c0,8);
                local_3c0 = vpalignr_avx2(local_3c0,auVar77,8);
                auVar77 = vperm2f128_avx(local_380,local_380,8);
                uVar49 = ptr_06[uVar33 + 1];
                auVar75 = vpblendd_avx2(auVar67,ZEXT832(uVar49),3);
                auVar67 = vpaddq_avx2(auVar75,(undefined1  [32])*ptr_04);
                uVar52 = auVar67._0_8_;
                if ((long)auVar67._0_8_ < (long)uVar24) {
                  uVar52 = uVar24;
                }
                uVar24 = vpextrq_avx(auVar67._0_16_,1);
                local_380 = vpalignr_avx2(local_380,auVar77,8);
                if ((long)uVar24 < (long)uVar45) {
                  uVar24 = uVar45;
                }
                uVar45 = uVar33 + 1;
                uVar53 = auVar67._16_8_;
                if ((long)auVar67._16_8_ < (long)uVar54) {
                  uVar53 = uVar54;
                }
                uVar54 = vpextrq_avx(auVar67._16_16_,1);
                auVar77 = vpcmpgtq_avx2(auVar116,auVar67);
                if ((long)uVar54 < (long)uVar55) {
                  uVar54 = uVar55;
                }
                auVar58._8_8_ = 0;
                auVar58._0_8_ = uVar54;
                auVar80._8_8_ = 0;
                auVar80._0_8_ = uVar53;
                auVar56 = vpunpcklqdq_avx(auVar80,auVar58);
                auVar59._8_8_ = 0;
                auVar59._0_8_ = uVar24;
                auVar81._8_8_ = 0;
                auVar81._0_8_ = uVar52;
                auVar109 = vpunpcklqdq_avx(auVar81,auVar59);
                auVar85 = vblendvpd_avx(local_2c0,auVar102,auVar77);
                auVar67 = vblendvpd_avx(local_3c0,auVar86,auVar77);
                auVar100 = vpaddq_avx2(local_380,(undefined1  [32])*ptr_05);
                auVar101._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar109;
                auVar101._16_16_ = ZEXT116(1) * auVar56;
                auVar77 = vblendvpd_avx(auVar100,local_2a0,auVar77);
                iVar27 = 1;
                do {
                  auVar100 = vperm2i128_avx2(auVar101,auVar101,8);
                  auVar100 = vpalignr_avx2(auVar101,auVar100,8);
                  auVar116 = vpaddq_avx2(auVar66,auVar100);
                  auVar100 = vperm2f128_avx(auVar85,auVar85,8);
                  auVar69 = vpalignr_avx2(auVar85,auVar100,8);
                  auVar100 = vperm2i128_avx2(auVar67,auVar67,8);
                  auVar7 = vpalignr_avx2(auVar67,auVar100,8);
                  auVar100 = vperm2f128_avx(auVar77,auVar77,8);
                  auVar100 = vpalignr_avx2(auVar77,auVar100,8);
                  auVar100 = vpaddq_avx2(auVar14,auVar100);
                  auVar68 = vpcmpgtq_avx2(auVar101,auVar116);
                  uVar24 = auVar116._0_8_;
                  if ((long)auVar116._0_8_ < (long)auVar101._0_8_) {
                    uVar24 = auVar101._0_8_;
                  }
                  uVar55 = vpextrq_avx(auVar101._0_16_,1);
                  uVar54 = vpextrq_avx(auVar116._0_16_,1);
                  if ((long)uVar54 < (long)uVar55) {
                    uVar54 = uVar55;
                  }
                  uVar55 = auVar116._16_8_;
                  if ((long)auVar116._16_8_ < (long)auVar101._16_8_) {
                    uVar55 = auVar101._16_8_;
                  }
                  auVar122._8_8_ = 0;
                  auVar122._0_8_ = uVar54;
                  auVar123._8_8_ = 0;
                  auVar123._0_8_ = uVar24;
                  auVar56 = vpunpcklqdq_avx(auVar123,auVar122);
                  lVar44 = vpextrq_avx(auVar101._16_16_,1);
                  auVar125._8_8_ = 0;
                  auVar125._0_8_ = uVar55;
                  auVar124._0_16_ = ZEXT116(0) * auVar125 + ZEXT116(1) * auVar56;
                  auVar124._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar125;
                  lVar43 = vpextrq_avx(auVar116._16_16_,1);
                  if (lVar43 < lVar44) {
                    lVar43 = lVar44;
                  }
                  auVar102._8_8_ = lVar43;
                  auVar102._0_8_ = lVar43;
                  auVar102._16_8_ = lVar43;
                  auVar102._24_8_ = lVar43;
                  auVar85 = vblendvpd_avx(auVar69,auVar85,auVar68);
                  auVar67 = vblendvpd_avx(auVar7,auVar67,auVar68);
                  auVar101 = vpblendd_avx2(auVar124,auVar102,0xc0);
                  auVar77 = vblendvpd_avx(auVar100,auVar77,auVar68);
                  iVar27 = iVar27 + -1;
                } while (iVar27 == 0);
                auVar103._8_8_ = uVar54;
                auVar103._0_8_ = uVar54;
                auVar103._16_8_ = uVar54;
                auVar103._24_8_ = uVar54;
                auVar100 = vperm2i128_avx2(auVar103,auVar103,0x18);
                auVar116 = vpalignr_avx2(auVar124,auVar100,8);
                auVar100 = vperm2f128_avx(auVar85,auVar85,8);
                auVar85 = vpalignr_avx2(auVar85,auVar100,8);
                auVar100 = vperm2i128_avx2(auVar67,auVar67,8);
                auVar67 = vpalignr_avx2(auVar67,auVar100,8);
                auVar100 = vperm2f128_avx(auVar77,auVar77,8);
                auVar77 = vpalignr_avx2(auVar77,auVar100,8);
                auVar86 = vpaddq_avx2(auVar116,ZEXT832(uVar40));
                if ((long)uVar49 < (long)auVar86._0_8_) {
                  uVar49 = auVar86._0_8_;
                }
                uVar24 = vpextrq_avx(auVar86._0_16_,1);
                if ((long)uVar25 < (long)uVar24) {
                  uVar25 = uVar24;
                }
                if ((long)uVar42 < (long)auVar86._16_8_) {
                  uVar42 = auVar86._16_8_;
                }
                auVar75 = vpcmpgtq_avx2(auVar86,auVar75);
                uVar24 = vpextrq_avx(auVar86._16_16_,1);
                if ((long)uVar23 < (long)uVar24) {
                  uVar23 = uVar24;
                }
                auVar60._8_8_ = 0;
                auVar60._0_8_ = uVar23;
                auVar91._8_8_ = 0;
                auVar91._0_8_ = uVar42;
                auVar56 = vpunpcklqdq_avx(auVar91,auVar60);
                auVar92._8_8_ = 0;
                auVar92._0_8_ = uVar25;
                auVar98._8_8_ = 0;
                auVar98._0_8_ = uVar49;
                auVar109 = vpunpcklqdq_avx(auVar98,auVar92);
                auVar100 = vblendvpd_avx(local_2c0,auVar85,auVar75);
                auVar116 = vblendvpd_avx(local_3c0,auVar67,auVar75);
                auVar117._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar109;
                auVar117._16_16_ = ZEXT116(1) * auVar56;
                auVar75 = vblendvpd_avx(local_380,auVar77,auVar75);
                lVar43 = 0;
                auVar115 = ZEXT3264(auVar115._0_32_);
                auVar121 = ZEXT3264(auVar121._0_32_);
                auVar69 = vpcmpeqd_avx2(auVar6,auVar6);
                do {
                  auVar101 = vpsubq_avx2(auVar117,auVar6);
                  auVar7 = vpsubq_avx2(auVar86,auVar65);
                  uVar23 = vpextrq_avx(auVar101._0_16_,1);
                  uVar42 = vpextrq_avx(auVar7._0_16_,1);
                  uVar25 = auVar7._0_8_;
                  if ((long)auVar7._0_8_ < (long)auVar101._0_8_) {
                    uVar25 = auVar101._0_8_;
                  }
                  if ((long)uVar42 < (long)uVar23) {
                    uVar42 = uVar23;
                  }
                  uVar24 = vpextrq_avx(auVar101._16_16_,1);
                  uVar49 = vpextrq_avx(auVar7._16_16_,1);
                  auVar68 = vpcmpgtq_avx2(auVar101,auVar7);
                  uVar23 = auVar7._16_8_;
                  if ((long)auVar7._16_8_ < (long)auVar101._16_8_) {
                    uVar23 = auVar101._16_8_;
                  }
                  auVar85 = vblendvpd_avx(auVar85,auVar100,auVar68);
                  auVar67 = vblendvpd_avx(auVar67,auVar116,auVar68);
                  uVar54 = *(ulong *)((long)*ptr + lVar43);
                  if ((long)uVar49 < (long)uVar24) {
                    uVar49 = uVar24;
                  }
                  uVar24 = *(ulong *)((long)*ptr + lVar43 + 8);
                  uVar55 = *(ulong *)((long)*b + lVar43);
                  uVar52 = *(ulong *)((long)*b + lVar43 + 8);
                  if ((long)uVar55 < (long)uVar54) {
                    uVar55 = uVar54;
                  }
                  uVar54 = *(ulong *)((long)*ptr + lVar43 + 0x18);
                  uVar53 = *(ulong *)((long)*ptr + lVar43 + 0x10);
                  if ((long)uVar52 < (long)uVar24) {
                    uVar52 = uVar24;
                  }
                  uVar24 = *(ulong *)((long)*b + lVar43 + 0x10);
                  if ((long)uVar24 < (long)uVar53) {
                    uVar24 = uVar53;
                  }
                  uVar53 = *(ulong *)((long)*b + lVar43 + 0x18);
                  if ((long)uVar53 < (long)uVar54) {
                    uVar53 = uVar54;
                  }
                  if ((long)uVar55 <= (long)uVar25) {
                    uVar55 = uVar25;
                  }
                  if ((long)uVar52 <= (long)uVar42) {
                    uVar52 = uVar42;
                  }
                  if ((long)uVar24 <= (long)uVar23) {
                    uVar24 = uVar23;
                  }
                  if ((long)uVar53 <= (long)uVar49) {
                    uVar53 = uVar49;
                  }
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar49;
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar23;
                  auVar56 = vpunpcklqdq_avx(auVar72,auVar61);
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = uVar42;
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = uVar25;
                  auVar109 = vpunpcklqdq_avx(auVar93,auVar82);
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = uVar53;
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = uVar24;
                  auVar110 = vpunpcklqdq_avx(auVar94,auVar62);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = uVar52;
                  auVar99._8_8_ = 0;
                  auVar99._0_8_ = uVar55;
                  auVar118 = vpunpcklqdq_avx(auVar99,auVar95);
                  auVar117._0_16_ = ZEXT116(0) * auVar110 + ZEXT116(1) * auVar118;
                  auVar110 = ZEXT116(1) * auVar110;
                  auVar117._16_16_ = auVar110;
                  pauVar1 = (undefined1 (*) [24])((long)*ptr + lVar43);
                  auVar70._0_8_ = -(ulong)(auVar117._0_8_ == *(long *)*pauVar1);
                  auVar70._8_8_ = -(ulong)(auVar117._8_8_ == *(long *)(*pauVar1 + 8));
                  auVar70._16_8_ = -(ulong)(auVar110._0_8_ == SUB248(*pauVar1,0x10));
                  auVar70._24_8_ = -(ulong)(auVar110._8_8_ == *(long *)pauVar1[1]);
                  uVar42 = vpextrq_avx(auVar121._0_16_,1);
                  uVar25 = auVar121._0_8_;
                  if ((long)uVar55 <= (long)auVar121._0_8_) {
                    uVar25 = uVar55;
                  }
                  uVar23 = vpextrq_avx(auVar121._16_16_,1);
                  if ((long)uVar52 <= (long)uVar42) {
                    uVar42 = uVar52;
                  }
                  uVar49 = auVar121._16_8_;
                  if ((long)uVar24 <= (long)auVar121._16_8_) {
                    uVar49 = uVar24;
                  }
                  auVar86._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar109;
                  auVar86._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
                  if ((long)uVar53 <= (long)uVar23) {
                    uVar23 = uVar53;
                  }
                  auVar76._0_8_ = -(ulong)(auVar117._0_8_ == auVar86._0_8_);
                  auVar76._8_8_ = -(ulong)(auVar117._8_8_ == auVar86._8_8_);
                  auVar76._16_8_ = -(ulong)(auVar110._0_8_ == auVar86._16_8_);
                  auVar76._24_8_ = -(ulong)(auVar110._8_8_ == auVar86._24_8_);
                  auVar100 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_00 + lVar43),auVar85,
                                           auVar76);
                  auVar100 = vblendvpd_avx(auVar100,*(undefined1 (*) [32])((long)*b_03 + lVar43),
                                           auVar70);
                  if ((long)uVar55 < (long)auVar115._0_8_) {
                    uVar55 = auVar115._0_8_;
                  }
                  uVar54 = vpextrq_avx(auVar115._0_16_,1);
                  if ((long)uVar52 < (long)uVar54) {
                    uVar52 = uVar54;
                  }
                  if ((long)uVar24 < (long)auVar115._16_8_) {
                    uVar24 = auVar115._16_8_;
                  }
                  uVar54 = vpextrq_avx(auVar115._16_16_,1);
                  auVar116 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_01 + lVar43),auVar67,
                                           auVar76);
                  auVar116 = vblendvpd_avx(auVar116,*(undefined1 (*) [32])((long)*b_04 + lVar43),
                                           auVar70);
                  if ((long)uVar53 < (long)uVar54) {
                    uVar53 = uVar54;
                  }
                  if ((long)uVar55 <= (long)auVar100._0_8_) {
                    uVar55 = auVar100._0_8_;
                  }
                  uVar54 = vpextrq_avx(auVar100._0_16_,1);
                  if ((long)uVar52 <= (long)uVar54) {
                    uVar52 = uVar54;
                  }
                  if ((long)uVar24 <= (long)auVar100._16_8_) {
                    uVar24 = auVar100._16_8_;
                  }
                  uVar54 = vpextrq_avx(auVar100._16_16_,1);
                  if ((long)uVar53 <= (long)uVar54) {
                    uVar53 = uVar54;
                  }
                  if ((long)uVar55 <= (long)auVar116._0_8_) {
                    uVar55 = auVar116._0_8_;
                  }
                  uVar54 = vpextrq_avx(auVar116._0_16_,1);
                  if ((long)uVar52 <= (long)uVar54) {
                    uVar52 = uVar54;
                  }
                  if ((long)uVar24 <= (long)auVar116._16_8_) {
                    uVar24 = auVar116._16_8_;
                  }
                  auVar77 = vblendvpd_avx(auVar77,auVar75,auVar68);
                  auVar77 = vpsubq_avx2(auVar77,auVar69);
                  auVar75 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_02 + lVar43),auVar77,
                                          auVar76);
                  auVar75 = vblendvpd_avx(auVar75,*(undefined1 (*) [32])((long)*b_05 + lVar43),
                                          auVar70);
                  uVar54 = vpextrq_avx(auVar116._16_16_,1);
                  if ((long)uVar53 <= (long)uVar54) {
                    uVar53 = uVar54;
                  }
                  if ((long)uVar55 <= (long)auVar75._0_8_) {
                    uVar55 = auVar75._0_8_;
                  }
                  uVar54 = vpextrq_avx(auVar75._0_16_,1);
                  if ((long)uVar52 <= (long)uVar54) {
                    uVar52 = uVar54;
                  }
                  if ((long)uVar24 <= (long)auVar75._16_8_) {
                    uVar24 = auVar75._16_8_;
                  }
                  uVar54 = vpextrq_avx(auVar75._16_16_,1);
                  if ((long)uVar53 <= (long)uVar54) {
                    uVar53 = uVar54;
                  }
                  auVar63._8_8_ = 0;
                  auVar63._0_8_ = uVar49;
                  auVar112._8_8_ = 0;
                  auVar112._0_8_ = uVar23;
                  auVar56 = vpunpcklqdq_avx(auVar63,auVar112);
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = uVar42;
                  auVar105._8_8_ = 0;
                  auVar105._0_8_ = uVar25;
                  auVar109 = vpunpcklqdq_avx(auVar105,auVar73);
                  auVar120._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar109;
                  auVar120._16_16_ = ZEXT116(1) * auVar56;
                  auVar121 = ZEXT3264(auVar120);
                  auVar106._8_8_ = 0;
                  auVar106._0_8_ = uVar53;
                  auVar113._8_8_ = 0;
                  auVar113._0_8_ = uVar24;
                  auVar56 = vpunpcklqdq_avx(auVar113,auVar106);
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar55;
                  auVar107._8_8_ = 0;
                  auVar107._0_8_ = uVar52;
                  auVar109 = vpunpcklqdq_avx(auVar64,auVar107);
                  auVar114._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar109;
                  auVar114._16_16_ = ZEXT116(1) * auVar56;
                  auVar115 = ZEXT3264(auVar114);
                  *(undefined1 (*) [32])((long)*ptr + lVar43) = auVar117;
                  *(undefined1 (*) [32])((long)*b_03 + lVar43) = auVar100;
                  *(undefined1 (*) [32])((long)*b_04 + lVar43) = auVar116;
                  *(undefined1 (*) [32])((long)*b_05 + lVar43) = auVar75;
                  lVar43 = lVar43 + 0x20;
                } while (lVar22 != lVar43);
                auVar77 = vpcmpgtq_avx2((undefined1  [32])*palVar48,auVar87._0_32_);
                uVar25 = (*palVar48)[0];
                if ((*palVar48)[0] < (long)auVar87._0_8_) {
                  uVar25 = auVar87._0_8_;
                }
                uVar23 = vpextrq_avx(auVar87._0_16_,1);
                uVar42 = (*palVar48)[1];
                if ((*palVar48)[1] < (long)uVar23) {
                  uVar42 = uVar23;
                }
                uVar23 = (*palVar48)[2];
                if ((*palVar48)[2] < (long)auVar87._16_8_) {
                  uVar23 = auVar87._16_8_;
                }
                uVar24 = vpextrq_avx(auVar87._16_16_,1);
                uVar49 = (*palVar48)[3];
                if ((*palVar48)[3] < (long)uVar24) {
                  uVar49 = uVar24;
                }
                auVar74._8_8_ = 0;
                auVar74._0_8_ = uVar49;
                auVar83._8_8_ = 0;
                auVar83._0_8_ = uVar23;
                auVar110 = vpunpcklqdq_avx(auVar83,auVar74);
                auVar67 = vblendvpd_avx(auVar104._0_32_,(undefined1  [32])b_03[uVar30],auVar77);
                auVar56 = auVar67._16_16_;
                auVar104 = ZEXT3264(auVar67);
                auVar84._8_8_ = 0;
                auVar84._0_8_ = uVar42;
                auVar96._8_8_ = 0;
                auVar96._0_8_ = uVar25;
                auVar118 = vpunpcklqdq_avx(auVar96,auVar84);
                auVar67 = vblendvpd_avx(auVar97._0_32_,(undefined1  [32])b_04[uVar30],auVar77);
                auVar109 = auVar67._16_16_;
                auVar97 = ZEXT3264(auVar67);
                auVar88 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110;
                auVar87 = ZEXT3264(CONCAT1616(auVar88,ZEXT116(0) * auVar110 + ZEXT116(1) * auVar118)
                                  );
                auVar67 = vblendvpd_avx(auVar78._0_32_,(undefined1  [32])b_05[uVar30],auVar77);
                auVar110 = auVar67._16_16_;
                auVar78 = ZEXT3264(auVar67);
                auVar13._8_8_ = -(ulong)(iVar18 == 2);
                auVar13._0_8_ = -(ulong)(iVar18 == 3);
                auVar13._16_8_ = -(ulong)(iVar18 == 1);
                auVar13._24_8_ = -(ulong)(iVar18 == 0);
                auVar13 = auVar13 & auVar77;
                local_3c8 = (int)uVar33;
                if ((((auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') || SUB321(auVar13 >> 0xbf,0) != '\0') ||
                    auVar13[0x1f] < '\0') {
                  iVar20 = local_3c8;
                }
                uVar33 = uVar45;
              } while (uVar45 != uVar41);
              if (s2_end == 0) {
                lVar26 = 0;
                lVar29 = 0;
                lVar35 = 0;
                uVar38 = uVar40;
              }
              else {
                if (iVar36 < 3) {
                  iVar27 = 1;
                  if (1 < iVar18) {
                    iVar27 = iVar18;
                  }
                  do {
                    auVar77 = auVar87._0_32_;
                    auVar66 = vperm2f128_avx(auVar77,auVar77,8);
                    auVar66 = vpalignr_avx2(auVar77,auVar66,8);
                    auVar88 = auVar66._16_16_;
                    auVar87 = ZEXT3264(auVar66);
                    auVar77 = auVar104._0_32_;
                    auVar66 = vperm2f128_avx(auVar77,auVar77,8);
                    auVar66 = vpalignr_avx2(auVar77,auVar66,8);
                    auVar56 = auVar66._16_16_;
                    auVar104 = ZEXT3264(auVar66);
                    auVar77 = auVar97._0_32_;
                    auVar66 = vperm2f128_avx(auVar77,auVar77,8);
                    auVar66 = vpalignr_avx2(auVar77,auVar66,8);
                    auVar109 = auVar66._16_16_;
                    auVar97 = ZEXT3264(auVar66);
                    auVar77 = auVar78._0_32_;
                    auVar66 = vperm2f128_avx(auVar77,auVar77,8);
                    auVar66 = vpalignr_avx2(auVar77,auVar66,8);
                    auVar110 = auVar66._16_16_;
                    auVar78 = ZEXT3264(auVar66);
                    iVar27 = iVar27 + -1;
                  } while (iVar27 != 0);
                }
                uVar38 = vpextrq_avx(auVar88,1);
                lVar26 = vpextrq_avx(auVar56,1);
                lVar29 = vpextrq_avx(auVar109,1);
                lVar35 = vpextrq_avx(auVar110,1);
              }
              iVar32 = (int)lVar35;
              iVar28 = (int)lVar29;
              iVar47 = (int)lVar26;
              iVar27 = iVar16;
              if ((s1_end != 0) && ((uVar46 & 0x7ffffffc) != 0)) {
                uVar46 = 0;
                do {
                  iVar47 = ((uint)uVar46 & 3) * uVar50 + ((uint)(uVar46 >> 2) & 0x3fffffff);
                  if (iVar47 < (int)uVar8) {
                    uVar51 = (*ptr)[uVar46];
                    iVar28 = iVar17;
                    if (((long)uVar38 < (long)uVar51) ||
                       (((uVar51 == uVar38 && (iVar20 == iVar17)) &&
                        (uVar51 = uVar38, iVar28 = iVar20, iVar47 < iVar27)))) {
                      iVar20 = iVar28;
                      uVar38 = uVar51;
                      lVar26 = (*b_03)[uVar46];
                      lVar29 = (*b_04)[uVar46];
                      lVar35 = (*b_05)[uVar46];
                      iVar27 = iVar47;
                    }
                  }
                  iVar32 = (int)lVar35;
                  iVar28 = (int)lVar29;
                  iVar47 = (int)lVar26;
                  uVar46 = uVar46 + 1;
                } while ((uVar50 & 0x1fffffff) << 2 != (int)uVar46);
              }
              iVar37 = (int)uVar38;
              if (s2_end == 0 && s1_end == 0) {
                alVar2 = ptr[uVar30];
                auVar56 = alVar2._16_16_;
                alVar3 = b_03[uVar30];
                auVar109 = alVar3._16_16_;
                alVar4 = b_04[uVar30];
                auVar110 = alVar4._16_16_;
                alVar5 = b_05[uVar30];
                auVar118 = alVar5._16_16_;
                if (iVar36 < 3) {
                  iVar20 = 1;
                  if (1 < iVar18) {
                    iVar20 = iVar18;
                  }
                  do {
                    auVar66 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar66,8);
                    auVar56 = alVar2._16_16_;
                    auVar66 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                    alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar66,8);
                    auVar109 = alVar3._16_16_;
                    auVar66 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                    alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar66,8);
                    auVar110 = alVar4._16_16_;
                    auVar66 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                    alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar66,8);
                    auVar118 = alVar5._16_16_;
                    iVar20 = iVar20 + -1;
                  } while (iVar20 != 0);
                }
                uVar39 = vpextrq_avx(auVar56,1);
                iVar37 = (int)uVar39;
                uVar39 = vpextrq_avx(auVar109,1);
                iVar47 = (int)uVar39;
                uVar39 = vpextrq_avx(auVar110,1);
                iVar28 = (int)uVar39;
                uVar39 = vpextrq_avx(auVar118,1);
                iVar32 = (int)uVar39;
                iVar20 = iVar17;
                iVar27 = iVar16;
              }
              auVar14._8_8_ = uVar40;
              auVar14._0_8_ = uVar40;
              auVar14._16_8_ = uVar40;
              auVar14._24_8_ = uVar40;
              auVar66 = vpcmpgtq_avx2(auVar14,auVar120);
              auVar15._8_8_ = lVar34;
              auVar15._0_8_ = lVar34;
              auVar15._16_8_ = lVar34;
              auVar15._24_8_ = lVar34;
              auVar77 = vpcmpgtq_avx2(auVar114,auVar15);
              auVar66 = vpor_avx2(auVar77,auVar66);
              if ((((auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar66 >> 0x7f,0) != '\0') || SUB321(auVar66 >> 0xbf,0) != '\0') ||
                  auVar66[0x1f] < '\0') {
                *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
                iVar37 = 0;
                iVar47 = 0;
                iVar28 = 0;
                iVar32 = 0;
                iVar20 = 0;
                iVar27 = 0;
              }
              ppVar21->score = iVar37;
              ppVar21->end_query = iVar27;
              ppVar21->end_ref = iVar20;
              ((ppVar21->field_4).stats)->matches = iVar47;
              ((ppVar21->field_4).stats)->similar = iVar28;
              ((ppVar21->field_4).stats)->length = iVar32;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar21;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile64.score;
    pvPm = (__m256i*)profile->profile64.matches;
    pvPs = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            vGapperL = _mm256_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHpM = _mm256_slli_si256_rpl(vHpM, 8);
        vHpS = _mm256_slli_si256_rpl(vHpS, 8);
        vHpL = _mm256_slli_si256_rpl(vHpL, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vF, vGapper),
                    _mm256_cmpeq_epi64(vF, vGapper));
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi64(vHp, vW);
            vHpM = _mm256_add_epi64(vHpM, vWM);
            vHpS = _mm256_add_epi64(vHpS, vWS);
            vHpL = _mm256_add_epi64(vHpL, vOne);
            case1 = _mm256_cmpgt_epi64(vE, vHp);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHtM = _mm256_slli_si256_rpl(vHtM, 8);
        vHtS = _mm256_slli_si256_rpl(vHtS, 8);
        vHtL = _mm256_slli_si256_rpl(vHtL, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi64(vGapper, vF),
                _mm256_cmpeq_epi64(vGapper, vF));
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 8);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 8);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vFt, vF),
                    _mm256_cmpeq_epi64(vFt, vF));
            vF = _mm256_max_epi64_rpl(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vFM = _mm256_slli_si256_rpl(vFM, 8);
        vFS = _mm256_slli_si256_rpl(vFS, 8);
        vFL = _mm256_slli_si256_rpl(vFL, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi64(vF, vHt);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vH = _mm256_max_epi64_rpl(vHp, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_max_epi64_rpl(vMaxH, vH);
            vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
                vHM = _mm256_slli_si256_rpl(vHM, 8);
                vHS = _mm256_slli_si256_rpl(vHS, 8);
                vHL = _mm256_slli_si256_rpl(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxM = _mm256_slli_si256_rpl(vMaxM, 8);
            vMaxS = _mm256_slli_si256_rpl(vMaxS, 8);
            vMaxL = _mm256_slli_si256_rpl(vMaxL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int64_t *m = (int64_t*)pvHM;
        int64_t *s = (int64_t*)pvHS;
        int64_t *l = (int64_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}